

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_mlvec.cpp
# Opt level: O3

MPP_RET vpu_api_mlvec_set_st_cfg(VpuApiMlvec ctx,VpuApiMlvecStaticCfg *cfg)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  RK_S32 RVar7;
  RK_S32 RVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  RK_S32 RVar14;
  RK_S32 RVar15;
  RK_S32 RVar16;
  RK_S32 RVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  MPP_RET MVar20;
  int iVar21;
  char *pcVar22;
  MppEncHeaderMode mode;
  
  if (ctx == (VpuApiMlvec)0x0 || cfg == (VpuApiMlvecStaticCfg *)0x0) {
    _mpp_log_l(2,"vpu_api_mlvec","invalid NULL input ctx %p cfg %p\n","vpu_api_mlvec_set_st_cfg");
    MVar20 = MPP_ERR_NULL_PTR;
  }
  else {
    if ((vpu_api_debug._2_1_ & 1) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","enter ctx %p cfg %p\n","vpu_api_mlvec_set_st_cfg",ctx,cfg);
    }
    MVar20 = vpu_api_mlvec_check_cfg(cfg);
    if (MVar20 != MPP_OK) {
      return MPP_NOK;
    }
    uVar5 = *(undefined4 *)cfg;
    uVar6 = *(undefined4 *)&cfg->height;
    RVar7 = cfg->rc_mode;
    RVar8 = cfg->bitRate;
    RVar9 = cfg->framerate;
    RVar10 = cfg->qp;
    RVar11 = cfg->enableCabac;
    RVar12 = cfg->cabacInitIdc;
    RVar13 = cfg->format;
    RVar14 = cfg->intraPicRate;
    RVar15 = cfg->framerateout;
    RVar16 = cfg->profileIdc;
    RVar17 = cfg->magic;
    uVar18 = *(undefined4 *)&cfg->field_0x38;
    uVar19 = *(undefined4 *)&cfg->field_0x3c;
    *(RK_S32 *)((long)ctx + 0x48) = cfg->levelIdc;
    *(RK_S32 *)((long)ctx + 0x4c) = RVar17;
    *(undefined4 *)((long)ctx + 0x50) = uVar18;
    *(undefined4 *)((long)ctx + 0x54) = uVar19;
    *(RK_S32 *)((long)ctx + 0x38) = RVar13;
    *(RK_S32 *)((long)ctx + 0x3c) = RVar14;
    *(RK_S32 *)((long)ctx + 0x40) = RVar15;
    *(RK_S32 *)((long)ctx + 0x44) = RVar16;
    *(RK_S32 *)((long)ctx + 0x28) = RVar9;
    *(RK_S32 *)((long)ctx + 0x2c) = RVar10;
    *(RK_S32 *)((long)ctx + 0x30) = RVar11;
    *(RK_S32 *)((long)ctx + 0x34) = RVar12;
    *(undefined4 *)((long)ctx + 0x18) = uVar5;
    *(undefined4 *)((long)ctx + 0x1c) = uVar6;
    *(RK_S32 *)((long)ctx + 0x20) = RVar7;
    *(RK_S32 *)((long)ctx + 0x24) = RVar8;
    lVar2 = *ctx;
    lVar3 = *(long *)((long)ctx + 8);
    lVar4 = *(long *)((long)ctx + 0x10);
    if ((((lVar2 == 0) &&
         (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"mpp_ctx",
                     "vpu_api_mlvec_set_st_cfg",0x8c), (DAT_0011234b & 0x10) != 0)) ||
        ((lVar3 == 0 &&
         (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"mpi",
                     "vpu_api_mlvec_set_st_cfg",0x8d), (DAT_0011234b & 0x10) != 0)))) ||
       ((lVar4 == 0 &&
        (_mpp_log_l(2,"vpu_api_mlvec","Assertion %s failed at %s:%d\n",0,"enc_cfg",
                    "vpu_api_mlvec_set_st_cfg",0x8e), (DAT_0011234b & 0x10) != 0)))) {
      abort();
    }
    if ((vpu_api_debug._2_1_ & 2) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","hdr_on_idr %d\n","vpu_api_mlvec_set_st_cfg",
                 (int)*(char *)((long)ctx + 0x52));
    }
    cVar1 = *(char *)((long)ctx + 0x52);
    MVar20 = (**(code **)(lVar3 + 0x70))(lVar2,0x328001);
    if (MVar20 != MPP_OK) {
      _mpp_log_l(2,"vpu_api_mlvec","setup enc header mode %d failed ret %d\n",0,cVar1 != '\0',MVar20
                );
    }
    if ((vpu_api_debug._2_1_ & 2) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","add_prefix %d\n","vpu_api_mlvec_set_st_cfg",
                 (int)*(char *)((long)ctx + 0x53));
    }
    mpp_enc_cfg_set_s32(lVar4,"h264:prefix_mode",(int)*(char *)((long)ctx + 0x53));
    if ((vpu_api_debug._2_1_ & 2) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","slice_mbs  %d\n","vpu_api_mlvec_set_st_cfg",
                 (int)*(short *)((long)ctx + 0x54));
    }
    if (*(short *)((long)ctx + 0x54) == 0) {
      pcVar22 = "split:mode";
      iVar21 = 0;
    }
    else {
      mpp_enc_cfg_set_u32(lVar4,"split:mode",2);
      iVar21 = (int)*(short *)((long)ctx + 0x54);
      pcVar22 = "split:arg";
    }
    mpp_enc_cfg_set_u32(lVar4,pcVar22,iVar21);
    vpu_api_mlvec_set_dy_max_tid(ctx,(int)*(char *)((long)ctx + 0x50));
    if ((vpu_api_debug._2_1_ & 1) != 0) {
      _mpp_log_l(4,"vpu_api_mlvec","leave ctx %p ret %d\n","vpu_api_mlvec_set_st_cfg",ctx,MVar20);
    }
  }
  return MVar20;
}

Assistant:

MPP_RET vpu_api_mlvec_set_st_cfg(VpuApiMlvec ctx, VpuApiMlvecStaticCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("invalid NULL input ctx %p cfg %p\n");
        return MPP_ERR_NULL_PTR;
    }

    mlvec_dbg_func("enter ctx %p cfg %p\n", ctx, cfg);

    /* check mlvec magic word */
    if (vpu_api_mlvec_check_cfg(cfg))
        return MPP_NOK;

    MPP_RET ret = MPP_OK;
    /* update static configure */
    VpuApiMlvecImpl *impl = (VpuApiMlvecImpl *)ctx;

    memcpy(&impl->st_cfg, cfg, sizeof(impl->st_cfg));
    cfg = &impl->st_cfg;

    /* get mpp context and check */
    MppCtx mpp_ctx = impl->mpp;
    MppApi *mpi = impl->mpi;
    MppEncCfg enc_cfg = impl->enc_cfg;

    mpp_assert(mpp_ctx);
    mpp_assert(mpi);
    mpp_assert(enc_cfg);

    /* start control mpp */
    mlvec_dbg_flow("hdr_on_idr %d\n", cfg->hdr_on_idr);
    MppEncHeaderMode mode = cfg->hdr_on_idr ?
                            MPP_ENC_HEADER_MODE_EACH_IDR :
                            MPP_ENC_HEADER_MODE_DEFAULT;

    ret = mpi->control(mpp_ctx, MPP_ENC_SET_HEADER_MODE, &mode);
    if (ret)
        mpp_err("setup enc header mode %d failed ret %d\n", mode, ret);

    mlvec_dbg_flow("add_prefix %d\n", cfg->add_prefix);
    mpp_enc_cfg_set_s32(enc_cfg, "h264:prefix_mode", cfg->add_prefix);

    mlvec_dbg_flow("slice_mbs  %d\n", cfg->slice_mbs);
    if (cfg->slice_mbs) {
        mpp_enc_cfg_set_u32(enc_cfg, "split:mode", MPP_ENC_SPLIT_BY_CTU);
        mpp_enc_cfg_set_u32(enc_cfg, "split:arg", cfg->slice_mbs);
    } else
        mpp_enc_cfg_set_u32(enc_cfg, "split:mode", MPP_ENC_SPLIT_NONE);

    /* NOTE: ltr_frames is already configured */
    vpu_api_mlvec_set_dy_max_tid(ctx, cfg->max_tid);

    mlvec_dbg_func("leave ctx %p ret %d\n", ctx, ret);

    return ret;
}